

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable)

{
  byte bVar1;
  bool multiple_files;
  FileDescriptor *file;
  FileDescriptor *descriptor_00;
  string local_48;
  byte local_21;
  Descriptor *pDStack_20;
  bool immutable_local;
  Descriptor *descriptor_local;
  ClassNameResolver *this_local;
  
  local_21 = immutable;
  pDStack_20 = descriptor;
  descriptor_local = (Descriptor *)this;
  this_local = (ClassNameResolver *)__return_storage_ptr__;
  (anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)descriptor,(Descriptor *)(ulong)(immutable & 1),
             SUB81(__return_storage_ptr__,0));
  file = Descriptor::file(pDStack_20);
  bVar1 = local_21;
  descriptor_00 = Descriptor::file(pDStack_20);
  multiple_files = MultipleJavaFiles(descriptor_00,(bool)(local_21 & 1));
  GetClassFullName(__return_storage_ptr__,this,&local_48,file,(bool)(bVar1 & 1),multiple_files);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                       bool immutable) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          MultipleJavaFiles(descriptor->file(), immutable));
}